

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O2

void Dau_TablesSave(int nInputs,int nVars,Vec_Mem_t *vTtMem,Vec_Int_t *vNodSup,int nFronts,
                   abctime clk)

{
  FILE *__s;
  word *__ptr;
  abctime aVar1;
  abctime time;
  int iVar2;
  int i;
  char FileName [100];
  
  iVar2 = 1 << ((char)nInputs - 6U & 0x1f);
  if (nInputs < 7) {
    iVar2 = 1;
  }
  sprintf(FileName,"npn%d%d.ttd",nInputs,nVars);
  __s = fopen(FileName,"wb");
  for (i = 0; i < vTtMem->nEntries; i = i + 1) {
    __ptr = Vec_MemReadEntry(vTtMem,i);
    fwrite(__ptr,8,(long)iVar2,__s);
  }
  fwrite(vNodSup->pArray,4,(long)vNodSup->nSize,__s);
  fclose(__s);
  printf("Dumped file \"%s\" with %10d classes after exploring %10d frontiers.  ",FileName,
         (ulong)(uint)vNodSup->nSize,(ulong)(uint)nFronts);
  aVar1 = Abc_Clock();
  Abc_PrintTime(0x82525c,(char *)(aVar1 - clk),time);
  fflush(_stdout);
  return;
}

Assistant:

void Dau_TablesSave( int nInputs, int nVars, Vec_Mem_t * vTtMem, Vec_Int_t * vNodSup, int nFronts, abctime clk )
{
    FILE * pFile; 
    char FileName[100];
    int i, nWords = Abc_TtWordNum(nInputs);
    // NPN classes
    sprintf( FileName, "npn%d%d.ttd", nInputs, nVars );
    pFile = fopen( FileName, "wb" );
    for ( i = 0; i < Vec_MemEntryNum(vTtMem); i++ )
        fwrite( Vec_MemReadEntry(vTtMem, i), 8, nWords, pFile );
    fwrite( Vec_IntArray(vNodSup), 4, Vec_IntSize(vNodSup), pFile );
    fclose( pFile );
//    printf( "Dumped files with %10d classes after exploring %10d frontiers.\n", 
//        Vec_IntSize(vNodSup), nFronts );
    printf( "Dumped file \"%s\" with %10d classes after exploring %10d frontiers.  ", 
        FileName, Vec_IntSize(vNodSup), nFronts );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    fflush(stdout);
}